

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error_code.hpp
# Opt level: O3

generic_code __thiscall
system_error2::_std_error_code_domain::_generic_code
          (_std_error_code_domain *this,status_code<void> *code)

{
  uint uVar1;
  long lVar2;
  long extraout_RDX;
  ulong uVar3;
  long *plVar4;
  generic_code gVar5;
  
  uVar3 = code->_domain->_id;
  if (uVar3 == (this->super_status_code_domain)._id) {
    plVar4 = (long *)(uVar3 ^ 0x223a160d20de97b4);
    uVar1 = (**(code **)(*plVar4 + 0x28))(plVar4,*(undefined4 *)&code[1]._domain);
    lVar2 = std::_V2::generic_category();
    uVar3 = 0xffffffff;
    if (extraout_RDX == lVar2) {
      uVar3 = (ulong)uVar1;
    }
    gVar5.
    super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
    .super_status_code_storage<system_error2::_generic_code_domain>._8_8_ = uVar3;
    gVar5.
    super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
    .super_status_code_storage<system_error2::_generic_code_domain>.super_status_code<void>._domain
         = (status_code_domain *)&generic_code_domain;
    return (generic_code)
           gVar5.
           super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
           .super_status_code_storage<system_error2::_generic_code_domain>;
  }
  __assert_fail("code.domain() == *this",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/std_error_code.hpp"
                ,0x113,
                "virtual generic_code system_error2::_std_error_code_domain::_generic_code(const status_code<void> &) const"
               );
}

Assistant:

inline generic_code _std_error_code_domain::_generic_code(const status_code<void> &code) const noexcept
{
  assert(code.domain() == *this);
  const auto &c = static_cast<const std_error_code &>(code);  // NOLINT
  // Ask my embedded error code for its mapping to std::errc, which is a subset of our generic_code errc.
  std::error_condition cond(c.category().default_error_condition(c.value()));
  if(cond.category() == std::generic_category())
  {
    return generic_code(static_cast<errc>(cond.value()));
  }
#if !defined(SYSTEM_ERROR2_NOT_POSIX) && !defined(_WIN32)
  if(cond.category() == std::system_category())
  {
    return generic_code(static_cast<errc>(cond.value()));
  }
#endif
  return errc::unknown;
}